

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::PushPopCommBuf::deserialize(PushPopCommBuf *this,A2A *a2a)

{
  pointer pPVar1;
  pointer puVar2;
  unsigned_long uVar3;
  ulong uVar4;
  exception *peVar5;
  long lVar6;
  long lVar7;
  size_t s;
  size_t sVar8;
  size_t sVar9;
  int iVar10;
  size_t n;
  size_t size;
  size_t id;
  size_t addr;
  ostream local_1c8 [408];
  
  lVar6 = 0;
  sVar8 = 0;
  do {
    uVar4 = (ulong)a2a->m_nprocs;
    if ((long)uVar4 <= lVar6) {
      iVar10 = 0;
      sVar8 = 0xffffffffffffffff;
      do {
        if ((int)uVar4 <= iVar10) {
          return;
        }
        deserial<unsigned_long>(a2a,iVar10,&n);
        sVar9 = n;
        if (iVar10 == 0) {
          addr = 0xffffffffffffffff;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (&this->m_popped_slots,n,&addr);
          sVar8 = sVar9;
        }
        else if (n != sVar8) {
          peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
          exception::exception((exception *)&addr,"bsp_pop_reg");
          std::operator<<(local_1c8,
                          "Not all processes popped the same number of memory blocks. For example, process 0 registered "
                         );
          std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
          std::operator<<(local_1c8," blocks, while process ");
          std::ostream::operator<<(local_1c8,iVar10);
          std::operator<<(local_1c8," registerd ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
          exception::exception(peVar5,(exception *)&addr);
          __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
        }
        for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
          size = 0xffffffffffffffff;
          deserial<unsigned_long>(a2a,iVar10,&size);
          if (size != 0xfffffffffffffffe) {
            if (size == 0xffffffffffffffff) {
              __assert_fail("slotid != no_slot()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                            ,0x1cf,"void bsplib::Rdma::PushPopCommBuf::deserialize(A2A &)");
            }
            puVar2 = (this->m_popped_slots).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar3 = puVar2[sVar9];
            if (uVar3 == 0xffffffffffffffff) {
              puVar2[sVar9] = size;
            }
            else if (uVar3 != size) {
              peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
              exception::exception((exception *)&addr,"bsp_pop_reg");
              std::operator<<(local_1c8,"Processes 0 and ");
              std::ostream::operator<<(local_1c8,iVar10);
              std::operator<<(local_1c8," did not pop the same memory registration");
              exception::exception(peVar5,(exception *)&addr);
              __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
            }
          }
        }
        iVar10 = iVar10 + 1;
        uVar4 = (ulong)(uint)a2a->m_nprocs;
      } while( true );
    }
    iVar10 = (int)lVar6;
    deserial<unsigned_long>(a2a,iVar10,&n);
    sVar9 = n;
    if (lVar6 == 0) {
      std::
      vector<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
      ::resize(&this->m_pushed_slots,(long)a2a->m_nprocs * n);
      sVar8 = sVar9;
    }
    else if (n != sVar8) {
      peVar5 = (exception *)__cxa_allocate_exception(0x1a0);
      exception::exception((exception *)&addr,"bsp_push_reg");
      std::operator<<(local_1c8,
                      "Not all processes registered the same number of memory blocks. For example, process 0 registered "
                     );
      std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      std::operator<<(local_1c8," blocks, while process ");
      std::ostream::operator<<(local_1c8,iVar10);
      std::operator<<(local_1c8," registerd ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1c8);
      exception::exception(peVar5,(exception *)&addr);
      __cxa_throw(peVar5,&exception::typeinfo,exception::~exception);
    }
    for (sVar9 = 0; sVar8 != sVar9; sVar9 = sVar9 + 1) {
      deserial<unsigned_long>(a2a,iVar10,&addr);
      deserial<unsigned_long>(a2a,iVar10,&size);
      deserial<unsigned_long>(a2a,iVar10,&id);
      lVar7 = (long)a2a->m_nprocs * sVar9;
      pPVar1 = (this->m_pushed_slots).
               super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar1[lVar7 + lVar6].block.addr = (void *)addr;
      pPVar1[lVar7 + lVar6].block.size = size;
      pPVar1[lVar7 + lVar6].block.status = 0;
      pPVar1[lVar7 + lVar6].slot = id;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Rdma::PushPopCommBuf::deserialize( A2A & a2a ) 
{
    size_t n_pushed_slots = 0;

    // read pushed slots
    for (int p = 0; p < a2a.nprocs(); ++p) {
        size_t n;
        deserial( a2a, p, n );

        if ( p == 0 ) {
            n_pushed_slots = n;
            m_pushed_slots.resize( a2a.nprocs() * n );
        } else if (n != n_pushed_slots )
            throw exception("bsp_push_reg") <<
                "Not all processes registered the same number of memory "
                "blocks. For example, process 0 registered " << n_pushed_slots
                << " blocks, while process " << p << " registerd " << n;

        for (size_t s = 0; s < n_pushed_slots; ++s) {
            char * null = NULL;
            size_t addr, size, id;
            deserial( a2a, p, addr);
            deserial( a2a, p, size);
            deserial( a2a, p, id );

            PushEntry entry = { { null + addr, size, Memblock::NORMAL }, id };
            m_pushed_slots[ p + s * a2a.nprocs() ] = entry ;
        }
    }

    // read popped slots
    size_t n_popped_slots = size_t(-1);
    for (int p = 0; p < a2a.nprocs(); ++p) {
        size_t n;
        deserial( a2a, p, n );

        if ( p == 0 ) {
            n_popped_slots = n;
            m_popped_slots.resize( n, no_slot() );
        } else if (n != n_popped_slots )
            throw exception("bsp_pop_reg") <<
                "Not all processes popped the same number of memory "
                "blocks. For example, process 0 registered " << n_popped_slots
                << " blocks, while process " << p << " registerd " << n;

        for (size_t s = 0; s < n_popped_slots; ++s) {
            Memslot slotid = no_slot();
            deserial( a2a, p, slotid );
            assert( slotid != no_slot() );

            if ( slotid != null_slot() ) {
                if ( m_popped_slots[s] == no_slot() ) {
                    m_popped_slots[s] = slotid;
                }
                else {
                    if (m_popped_slots[s] != slotid ) {
                        throw exception("bsp_pop_reg") <<
                            "Processes 0 and " << p << " did not pop "
                            "the same memory registration";
                    }
                }
            }
        }
    }
    
}